

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::MultiHeadAttention_x86_avx::create_pipeline(MultiHeadAttention_x86_avx *this,Option *opt)

{
  _func_int *p_Var1;
  int *piVar2;
  void *pvVar3;
  long *plVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined4 uVar7;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined8 uVar15;
  undefined4 uVar16;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined1 uVar23;
  Layer *pLVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 in_ZMM0 [64];
  float fVar27;
  ParamDict pd;
  Option opt1;
  undefined8 uStack_118;
  undefined8 auStack_10c [2];
  undefined8 uStack_f8;
  undefined1 auStack_f0 [8];
  undefined1 auStack_ec [8];
  undefined8 uStack_e4;
  Mat local_d8;
  void *local_90;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  long *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined8 local_50;
  ModelBinFromMatArray local_48;
  float local_34;
  undefined4 uVar9;
  undefined3 uVar11;
  undefined2 uVar13;
  undefined4 uVar18;
  undefined3 uVar20;
  undefined2 uVar22;
  
  auVar26._0_4_ =
       (float)(*(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86_avx[-3]) /
              *(int *)(&this->field_0xd4 + (long)this->_vptr_MultiHeadAttention_x86_avx[-3]));
  auVar26._4_12_ = in_ZMM0._4_12_;
  auVar5 = vrsqrtss_avx(auVar26,auVar26);
  fVar27 = auVar5._0_4_;
  local_34 = fVar27 * -0.5 * (auVar26._0_4_ * fVar27 * fVar27 + -3.0);
  auStack_f0 = (undefined1  [8])0x523062;
  pLVar24 = create_layer(0x4a);
  this->q_gemm = pLVar24;
  auStack_f0 = (undefined1  [8])0x523071;
  ParamDict::ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x523084;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0,local_34);
  auStack_f0 = (undefined1  [8])0x523099;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),1,1.0);
  auStack_f0 = (undefined1  [8])0x5230a8;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),2,0);
  auStack_f0 = (undefined1  [8])0x5230ba;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),3,1);
  auStack_f0 = (undefined1  [8])0x5230cc;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),4,1);
  auStack_f0 = (undefined1  [8])0x5230db;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),5,0);
  auStack_f0 = (undefined1  [8])0x5230ed;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),6,1);
  auStack_f0 = (undefined1  [8])0x523108;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),7,
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86_avx[-3]));
  auStack_f0 = (undefined1  [8])0x523117;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),8,0);
  auStack_f0 = (undefined1  [8])0x523132;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),9,
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86_avx[-3]));
  auStack_f0 = (undefined1  [8])0x523144;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),10,1);
  auStack_f0 = (undefined1  [8])0x523153;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xb,0);
  auStack_f0 = (undefined1  [8])0x523165;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xc,1);
  auStack_f0 = (undefined1  [8])0x523174;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xe,0);
  auStack_f0 = (undefined1  [8])0x523181;
  (*this->q_gemm->_vptr_Layer[2])(this->q_gemm,(undefined1 *)((long)register0x00000020 + -0xec) + 4)
  ;
  lVar25 = 0x40;
  do {
    *(undefined8 *)((long)&local_d8.data + lVar25) = 0;
    *(undefined8 *)((long)&uStack_118 + lVar25) = 0;
    *(undefined8 *)(&stack0xfffffffffffffef0 + lVar25) = 0;
    *(undefined8 *)((long)auStack_10c + lVar25) = 0;
    *(undefined8 *)((long)auStack_10c + lVar25 + 8) = 0;
    *(undefined8 *)((long)&uStack_f8 + lVar25) = 0;
    *(undefined8 *)(&stack0xffffffffffffff10 + lVar25) = 0;
    *(undefined8 *)((undefined1 *)((long)register0x00000020 + -0xec) + lVar25) = 0;
    *(undefined8 *)((long)&uStack_e4 + lVar25) = 0;
    lVar25 = lVar25 + 0x48;
  } while (lVar25 != 0xd0);
  p_Var1 = this->_vptr_MultiHeadAttention_x86_avx[-3];
  if (&local_d8 != (Mat *)(&this->field_0xe8 + (long)p_Var1)) {
    piVar2 = *(int **)(&this->field_0xf0 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x52321b;
            free(local_d8.data);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x52320c;
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_d8.data = *(void **)(&this->field_0xe8 + (long)p_Var1);
    local_d8.refcount._0_4_ = (undefined4)*(undefined8 *)(&this->field_0xf0 + (long)p_Var1);
    local_d8.refcount._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0xf0 + (long)p_Var1) >> 0x20);
    local_d8.elemsize._0_4_ = (undefined4)*(undefined8 *)(&this->field_0xf8 + (long)p_Var1);
    local_d8.elemsize._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0xf8 + (long)p_Var1) >> 0x20);
    local_d8.elempack = *(int *)(&this->field_0x100 + (long)p_Var1);
    local_d8.allocator = *(Allocator **)(&this->field_0x108 + (long)p_Var1);
    local_d8._40_8_ = *(undefined8 *)(&this->field_0x110 + (long)p_Var1);
    local_d8._48_8_ = *(undefined8 *)(&this->field_0x118 + (long)p_Var1);
    local_d8._60_4_ = local_d8._60_4_;
    local_d8.c = *(int *)(&this->field_0x120 + (long)p_Var1);
    local_d8.cstep = *(size_t *)(&this->field_0x128 + (long)p_Var1);
  }
  p_Var1 = this->_vptr_MultiHeadAttention_x86_avx[-3];
  if (&local_90 != (void **)(&this->field_0x130 + (long)p_Var1)) {
    piVar2 = *(int **)(&this->field_0x138 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(uStack_84,uStack_88);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_70 == (long *)0x0) {
          if (local_90 != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x5232fe;
            free(local_90);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x5232ef;
          (**(code **)(*local_70 + 0x18))();
        }
      }
    }
    local_90 = *(void **)(&this->field_0x130 + (long)p_Var1);
    uStack_88 = (undefined4)*(undefined8 *)(&this->field_0x138 + (long)p_Var1);
    uStack_84 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x138 + (long)p_Var1) >> 0x20);
    uStack_80 = (undefined4)*(undefined8 *)(&this->field_0x140 + (long)p_Var1);
    uStack_7c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x140 + (long)p_Var1) >> 0x20);
    uStack_78 = *(undefined4 *)(&this->field_0x148 + (long)p_Var1);
    local_70 = *(long **)(&this->field_0x150 + (long)p_Var1);
    local_68 = *(undefined8 *)(&this->field_0x158 + (long)p_Var1);
    uStack_60 = *(undefined8 *)(&this->field_0x160 + (long)p_Var1);
    local_58 = *(undefined4 *)(&this->field_0x168 + (long)p_Var1);
    local_50 = *(undefined8 *)(&this->field_0x170 + (long)p_Var1);
  }
  pLVar24 = this->q_gemm;
  auStack_f0 = (undefined1  [8])0x5233a8;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_48,&local_d8);
  auStack_f0 = (undefined1  [8])0x5233ba;
  (*pLVar24->_vptr_Layer[3])(pLVar24,&local_48);
  auStack_f0 = (undefined1  [8])0x5233c7;
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_48);
  auStack_f0 = (undefined1  [8])0x5233d4;
  (*this->q_gemm->_vptr_Layer[4])(this->q_gemm,opt);
  if (opt->lightmode != false) {
    p_Var1 = this->_vptr_MultiHeadAttention_x86_avx[-3];
    piVar2 = *(int **)(&this->field_0xf0 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x108 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0xe8 + (long)p_Var1) != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x523425;
            free(*(void **)(&this->field_0xe8 + (long)p_Var1));
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x523416;
          (**(code **)(**(long **)(&this->field_0x108 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x128 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0xf4 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0xfc + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0xe8 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0xf0 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x110 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x118 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x120 + (long)p_Var1) = 0;
    p_Var1 = this->_vptr_MultiHeadAttention_x86_avx[-3];
    piVar2 = *(int **)(&this->field_0x138 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x150 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x130 + (long)p_Var1) != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x5234a9;
            free(*(void **)(&this->field_0x130 + (long)p_Var1));
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x523496;
          (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x170 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x13c + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x144 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x130 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x138 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x168 + (long)p_Var1) = 0;
  }
  lVar25 = 0x48;
  do {
    piVar2 = *(int **)((long)&local_d8.refcount + lVar25);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = *(void **)((long)&local_d8.data + lVar25);
        plVar4 = *(long **)((long)&local_d8.allocator + lVar25);
        if (plVar4 == (long *)0x0) {
          if (pvVar3 != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x523523;
            free(pvVar3);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x523510;
          (**(code **)(*plVar4 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_d8.cstep + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar25 + 4) = 0;
    *(undefined8 *)((long)&local_d8.elemsize + lVar25 + 4) = 0;
    *(undefined8 *)((long)&local_d8.data + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.dims + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.h + lVar25) = 0;
    *(undefined4 *)((long)&local_d8.c + lVar25) = 0;
    lVar25 = lVar25 + -0x48;
  } while (lVar25 != -0x48);
  auStack_f0 = (undefined1  [8])0x52355e;
  ParamDict::~ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x523568;
  pLVar24 = create_layer(0x4a);
  this->k_gemm = pLVar24;
  auStack_f0 = (undefined1  [8])0x523577;
  ParamDict::ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x523586;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),2,0);
  auStack_f0 = (undefined1  [8])0x523598;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),3,1);
  auStack_f0 = (undefined1  [8])0x5235aa;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),4,1);
  auStack_f0 = (undefined1  [8])0x5235b9;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),5,0);
  auStack_f0 = (undefined1  [8])0x5235cb;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),6,1);
  auStack_f0 = (undefined1  [8])0x5235e6;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),7,
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86_avx[-3]));
  auStack_f0 = (undefined1  [8])0x5235f5;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),8,0);
  auStack_f0 = (undefined1  [8])0x523610;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),9,
                 *(int *)(&this->field_0xdc + (long)this->_vptr_MultiHeadAttention_x86_avx[-3]));
  auStack_f0 = (undefined1  [8])0x523622;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),10,1);
  auStack_f0 = (undefined1  [8])0x523631;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xb,0);
  auStack_f0 = (undefined1  [8])0x523643;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xc,1);
  auStack_f0 = (undefined1  [8])0x523652;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xe,0);
  auStack_f0 = (undefined1  [8])0x52365f;
  (*this->k_gemm->_vptr_Layer[2])(this->k_gemm,(undefined1 *)((long)register0x00000020 + -0xec) + 4)
  ;
  lVar25 = 0x40;
  do {
    *(undefined8 *)((long)&local_d8.data + lVar25) = 0;
    *(undefined8 *)((long)&uStack_118 + lVar25) = 0;
    *(undefined8 *)(&stack0xfffffffffffffef0 + lVar25) = 0;
    *(undefined8 *)((long)auStack_10c + lVar25) = 0;
    *(undefined8 *)((long)auStack_10c + lVar25 + 8) = 0;
    *(undefined8 *)((long)&uStack_f8 + lVar25) = 0;
    *(undefined8 *)(&stack0xffffffffffffff10 + lVar25) = 0;
    *(undefined8 *)((undefined1 *)((long)register0x00000020 + -0xec) + lVar25) = 0;
    *(undefined8 *)((long)&uStack_e4 + lVar25) = 0;
    lVar25 = lVar25 + 0x48;
  } while (lVar25 != 0xd0);
  p_Var1 = this->_vptr_MultiHeadAttention_x86_avx[-3];
  if (&local_d8 != (Mat *)(&this->field_0x178 + (long)p_Var1)) {
    piVar2 = *(int **)(&this->field_0x180 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x5236f5;
            free(local_d8.data);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x5236e6;
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_d8.data = *(void **)(&this->field_0x178 + (long)p_Var1);
    local_d8.refcount._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x180 + (long)p_Var1);
    local_d8.refcount._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x180 + (long)p_Var1) >> 0x20);
    local_d8.elemsize._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x188 + (long)p_Var1);
    local_d8.elemsize._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x188 + (long)p_Var1) >> 0x20);
    local_d8.elempack = *(int *)(&this->field_0x190 + (long)p_Var1);
    local_d8.allocator = *(Allocator **)(&this->field_0x198 + (long)p_Var1);
    local_d8._40_8_ = *(undefined8 *)(&this->field_0x1a0 + (long)p_Var1);
    local_d8._48_8_ = *(undefined8 *)(&this->field_0x1a8 + (long)p_Var1);
    local_d8._60_4_ = local_d8._60_4_;
    local_d8.c = *(int *)(&this->field_0x1b0 + (long)p_Var1);
    local_d8.cstep = *(size_t *)(&this->field_0x1b8 + (long)p_Var1);
  }
  p_Var1 = this->_vptr_MultiHeadAttention_x86_avx[-3];
  if (&local_90 != (void **)(&this->field_0x1c0 + (long)p_Var1)) {
    piVar2 = *(int **)(&this->field_0x1c8 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(uStack_84,uStack_88);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_70 == (long *)0x0) {
          if (local_90 != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x5237da;
            free(local_90);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x5237cb;
          (**(code **)(*local_70 + 0x18))();
        }
      }
    }
    local_90 = *(void **)(&this->field_0x1c0 + (long)p_Var1);
    uStack_88 = (undefined4)*(undefined8 *)(&this->field_0x1c8 + (long)p_Var1);
    uStack_84 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1c8 + (long)p_Var1) >> 0x20);
    uStack_80 = (undefined4)*(undefined8 *)(&this->field_0x1d0 + (long)p_Var1);
    uStack_7c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1d0 + (long)p_Var1) >> 0x20);
    uStack_78 = *(undefined4 *)(&this->field_0x1d8 + (long)p_Var1);
    local_70 = *(long **)(&this->field_0x1e0 + (long)p_Var1);
    local_68 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var1);
    uStack_60 = *(undefined8 *)(&this->field_0x1f0 + (long)p_Var1);
    local_58 = *(undefined4 *)(&this->field_0x1f8 + (long)p_Var1);
    local_50 = *(undefined8 *)(&this->field_0x200 + (long)p_Var1);
  }
  pLVar24 = this->k_gemm;
  auStack_f0 = (undefined1  [8])0x523884;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_48,&local_d8);
  auStack_f0 = (undefined1  [8])0x523896;
  (*pLVar24->_vptr_Layer[3])(pLVar24,&local_48);
  auStack_f0 = (undefined1  [8])0x5238a3;
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_48);
  auStack_f0 = (undefined1  [8])0x5238b0;
  (*this->k_gemm->_vptr_Layer[4])(this->k_gemm,opt);
  if (opt->lightmode != false) {
    p_Var1 = this->_vptr_MultiHeadAttention_x86_avx[-3];
    piVar2 = *(int **)(&this->field_0x180 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x198 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x178 + (long)p_Var1) != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x523901;
            free(*(void **)(&this->field_0x178 + (long)p_Var1));
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x5238f2;
          (**(code **)(**(long **)(&this->field_0x198 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1b8 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x184 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x18c + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x178 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x180 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x1a0 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x1a8 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x1b0 + (long)p_Var1) = 0;
    p_Var1 = this->_vptr_MultiHeadAttention_x86_avx[-3];
    piVar2 = *(int **)(&this->field_0x1c8 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x1e0 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x1c0 + (long)p_Var1) != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x523985;
            free(*(void **)(&this->field_0x1c0 + (long)p_Var1));
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x523972;
          (**(code **)(**(long **)(&this->field_0x1e0 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x200 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x1cc + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x1d4 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x1c0 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x1c8 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x1e8 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x1f0 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x1f8 + (long)p_Var1) = 0;
  }
  lVar25 = 0x48;
  do {
    piVar2 = *(int **)((long)&local_d8.refcount + lVar25);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = *(void **)((long)&local_d8.data + lVar25);
        plVar4 = *(long **)((long)&local_d8.allocator + lVar25);
        if (plVar4 == (long *)0x0) {
          if (pvVar3 != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x5239ff;
            free(pvVar3);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x5239ec;
          (**(code **)(*plVar4 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_d8.cstep + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar25 + 4) = 0;
    *(undefined8 *)((long)&local_d8.elemsize + lVar25 + 4) = 0;
    *(undefined8 *)((long)&local_d8.data + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.dims + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.h + lVar25) = 0;
    *(undefined4 *)((long)&local_d8.c + lVar25) = 0;
    lVar25 = lVar25 + -0x48;
  } while (lVar25 != -0x48);
  auStack_f0 = (undefined1  [8])0x523a3a;
  ParamDict::~ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x523a44;
  pLVar24 = create_layer(0x4a);
  this->v_gemm = pLVar24;
  auStack_f0 = (undefined1  [8])0x523a53;
  ParamDict::ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x523a62;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),2,0);
  auStack_f0 = (undefined1  [8])0x523a74;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),3,1);
  auStack_f0 = (undefined1  [8])0x523a86;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),4,1);
  auStack_f0 = (undefined1  [8])0x523a95;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),5,0);
  auStack_f0 = (undefined1  [8])0x523aa7;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),6,1);
  auStack_f0 = (undefined1  [8])0x523ac2;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),7,
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86_avx[-3]));
  auStack_f0 = (undefined1  [8])0x523ad1;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),8,0);
  auStack_f0 = (undefined1  [8])0x523aec;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),9,
                 *(int *)(&this->field_0xe0 + (long)this->_vptr_MultiHeadAttention_x86_avx[-3]));
  auStack_f0 = (undefined1  [8])0x523afe;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),10,1);
  auStack_f0 = (undefined1  [8])0x523b0d;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xb,0);
  auStack_f0 = (undefined1  [8])0x523b1f;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xc,1);
  auStack_f0 = (undefined1  [8])0x523b2e;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xe,0);
  auStack_f0 = (undefined1  [8])0x523b3b;
  (*this->v_gemm->_vptr_Layer[2])(this->v_gemm,(undefined1 *)((long)register0x00000020 + -0xec) + 4)
  ;
  lVar25 = 0x40;
  do {
    *(undefined8 *)((long)&local_d8.data + lVar25) = 0;
    *(undefined8 *)((long)&uStack_118 + lVar25) = 0;
    *(undefined8 *)(&stack0xfffffffffffffef0 + lVar25) = 0;
    *(undefined8 *)((long)auStack_10c + lVar25) = 0;
    *(undefined8 *)((long)auStack_10c + lVar25 + 8) = 0;
    *(undefined8 *)((long)&uStack_f8 + lVar25) = 0;
    *(undefined8 *)(&stack0xffffffffffffff10 + lVar25) = 0;
    *(undefined8 *)((undefined1 *)((long)register0x00000020 + -0xec) + lVar25) = 0;
    *(undefined8 *)((long)&uStack_e4 + lVar25) = 0;
    lVar25 = lVar25 + 0x48;
  } while (lVar25 != 0xd0);
  p_Var1 = this->_vptr_MultiHeadAttention_x86_avx[-3];
  if (&local_d8 != (Mat *)(&this->field_0x208 + (long)p_Var1)) {
    piVar2 = *(int **)(&this->field_0x210 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x523bd1;
            free(local_d8.data);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x523bc2;
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_d8.data = *(void **)(&this->field_0x208 + (long)p_Var1);
    local_d8.refcount._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x210 + (long)p_Var1);
    local_d8.refcount._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x210 + (long)p_Var1) >> 0x20);
    local_d8.elemsize._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x218 + (long)p_Var1);
    local_d8.elemsize._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x218 + (long)p_Var1) >> 0x20);
    local_d8.elempack = *(int *)(&this->field_0x220 + (long)p_Var1);
    local_d8.allocator = *(Allocator **)(&this->field_0x228 + (long)p_Var1);
    local_d8._40_8_ = *(undefined8 *)(&this->field_0x230 + (long)p_Var1);
    local_d8._48_8_ = *(undefined8 *)(&this->field_0x238 + (long)p_Var1);
    local_d8._60_4_ = local_d8._60_4_;
    local_d8.c = *(int *)(&this->field_0x240 + (long)p_Var1);
    local_d8.cstep = *(size_t *)(&this->field_0x248 + (long)p_Var1);
  }
  p_Var1 = this->_vptr_MultiHeadAttention_x86_avx[-3];
  if (&local_90 != (void **)(&this->field_0x250 + (long)p_Var1)) {
    piVar2 = *(int **)(&this->field_0x258 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(uStack_84,uStack_88);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_70 == (long *)0x0) {
          if (local_90 != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x523cb6;
            free(local_90);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x523ca7;
          (**(code **)(*local_70 + 0x18))();
        }
      }
    }
    local_90 = *(void **)(&this->field_0x250 + (long)p_Var1);
    uStack_88 = (undefined4)*(undefined8 *)(&this->field_0x258 + (long)p_Var1);
    uStack_84 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x258 + (long)p_Var1) >> 0x20);
    uStack_80 = (undefined4)*(undefined8 *)(&this->field_0x260 + (long)p_Var1);
    uStack_7c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x260 + (long)p_Var1) >> 0x20);
    uStack_78 = *(undefined4 *)(&this->field_0x268 + (long)p_Var1);
    local_70 = *(long **)(&this->field_0x270 + (long)p_Var1);
    local_68 = *(undefined8 *)(&this->field_0x278 + (long)p_Var1);
    uStack_60 = *(undefined8 *)(&this->field_0x280 + (long)p_Var1);
    local_58 = *(undefined4 *)(&this->field_0x288 + (long)p_Var1);
    local_50 = *(undefined8 *)(&this->field_0x290 + (long)p_Var1);
  }
  pLVar24 = this->v_gemm;
  auStack_f0 = (undefined1  [8])0x523d5d;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_48,&local_d8);
  auStack_f0 = (undefined1  [8])0x523d6e;
  (*pLVar24->_vptr_Layer[3])(pLVar24,&local_48);
  auStack_f0 = (undefined1  [8])0x523d7b;
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_48);
  auStack_f0 = (undefined1  [8])0x523d88;
  (*this->v_gemm->_vptr_Layer[4])(this->v_gemm,opt);
  if (opt->lightmode != false) {
    p_Var1 = this->_vptr_MultiHeadAttention_x86_avx[-3];
    piVar2 = *(int **)(&this->field_0x210 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x228 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x208 + (long)p_Var1) != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x523dd7;
            free(*(void **)(&this->field_0x208 + (long)p_Var1));
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x523dc8;
          (**(code **)(**(long **)(&this->field_0x228 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x248 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x214 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x21c + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x208 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x210 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x230 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x238 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x240 + (long)p_Var1) = 0;
    p_Var1 = this->_vptr_MultiHeadAttention_x86_avx[-3];
    piVar2 = *(int **)(&this->field_0x258 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x270 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x250 + (long)p_Var1) != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x523e56;
            free(*(void **)(&this->field_0x250 + (long)p_Var1));
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x523e43;
          (**(code **)(**(long **)(&this->field_0x270 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x290 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x25c + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x264 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x250 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x258 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x278 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x280 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x288 + (long)p_Var1) = 0;
  }
  lVar25 = 0x48;
  do {
    piVar2 = *(int **)((long)&local_d8.refcount + lVar25);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = *(void **)((long)&local_d8.data + lVar25);
        plVar4 = *(long **)((long)&local_d8.allocator + lVar25);
        if (plVar4 == (long *)0x0) {
          if (pvVar3 != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x523ecd;
            free(pvVar3);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x523eba;
          (**(code **)(*plVar4 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_d8.cstep + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar25 + 4) = 0;
    *(undefined8 *)((long)&local_d8.elemsize + lVar25 + 4) = 0;
    *(undefined8 *)((long)&local_d8.data + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.dims + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.h + lVar25) = 0;
    *(undefined4 *)((long)&local_d8.c + lVar25) = 0;
    lVar25 = lVar25 + -0x48;
  } while (lVar25 != -0x48);
  auStack_f0 = (undefined1  [8])0x523f08;
  ParamDict::~ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x523f12;
  pLVar24 = create_layer(0x4a);
  this->qk_gemm = pLVar24;
  auStack_f0 = (undefined1  [8])0x523f21;
  ParamDict::ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x523f33;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),2,1);
  auStack_f0 = (undefined1  [8])0x523f42;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),3,0);
  auStack_f0 = (undefined1  [8])0x523f51;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),4,0);
  auStack_f0 = (undefined1  [8])0x523f60;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),5,0);
  auStack_f0 = (undefined1  [8])0x523f81;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),6,
                 (uint)(*(int *)(&this->field_0xe4 +
                                (long)this->_vptr_MultiHeadAttention_x86_avx[-3]) == 0));
  auStack_f0 = (undefined1  [8])0x523f90;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),7,0);
  auStack_f0 = (undefined1  [8])0x523f9f;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),8,0);
  auStack_f0 = (undefined1  [8])0x523fb0;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),9,0);
  auStack_f0 = (undefined1  [8])0x523fd3;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),10,
                 -(uint)(*(int *)(&this->field_0xe4 +
                                 (long)this->_vptr_MultiHeadAttention_x86_avx[-3]) == 0) | 3);
  auStack_f0 = (undefined1  [8])0x523fe2;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xb,0);
  auStack_f0 = (undefined1  [8])0x523ff4;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xc,1);
  auStack_f0 = (undefined1  [8])0x524001;
  (*this->qk_gemm->_vptr_Layer[2])();
  pLVar24 = this->qk_gemm;
  auStack_f0 = (undefined1  [8])0x524011;
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_d8,(Mat *)0x0);
  auStack_f0 = (undefined1  [8])0x52401f;
  (*pLVar24->_vptr_Layer[3])(pLVar24,&local_d8);
  auStack_f0 = (undefined1  [8])0x52402c;
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_d8);
  uVar6._0_1_ = opt->lightmode;
  uVar6._1_3_ = *(undefined3 *)&opt->field_0x1;
  uVar6._4_4_ = opt->num_threads;
  uVar7 = opt->openmp_blocktime;
  uVar8 = opt->use_winograd_convolution;
  uVar10 = opt->use_sgemm_convolution;
  uVar12 = opt->use_int8_inference;
  uVar14 = opt->use_vulkan_compute;
  uVar13 = CONCAT11(uVar14,uVar12);
  uVar11 = CONCAT21(uVar13,uVar10);
  uVar9 = CONCAT31(uVar11,uVar8);
  local_d8.allocator = *(Allocator **)&opt->use_bf16_storage;
  local_d8._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
  local_d8._48_8_ = *(undefined8 *)&opt->flush_denormals;
  local_d8._56_8_ = *(undefined8 *)&opt->use_winograd43_convolution;
  local_d8.refcount._0_4_ = SUB84(opt->blob_allocator,0);
  local_d8.refcount._4_4_ = (undefined4)((ulong)opt->blob_allocator >> 0x20);
  local_d8.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
  local_d8.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
  local_d8.data._0_4_ = (undefined4)uVar6;
  local_d8.data = (void *)CONCAT44(1,local_d8.data._0_4_);
  auStack_f0 = (undefined1  [8])0x52405c;
  local_d8.elempack = uVar7;
  local_d8._28_4_ = uVar9;
  (*this->qk_gemm->_vptr_Layer[4])(this->qk_gemm,&local_d8);
  auStack_f0 = (undefined1  [8])0x524064;
  ParamDict::~ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x52406e;
  pLVar24 = create_layer(0x4a);
  this->qkv_gemm = pLVar24;
  auStack_f0 = (undefined1  [8])0x52407d;
  ParamDict::ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x52408c;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),2,0);
  auStack_f0 = (undefined1  [8])0x52409e;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),3,1);
  auStack_f0 = (undefined1  [8])0x5240ad;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),4,0);
  auStack_f0 = (undefined1  [8])0x5240bc;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),5,0);
  auStack_f0 = (undefined1  [8])0x5240ce;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),6,1);
  auStack_f0 = (undefined1  [8])0x5240dd;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),7,0);
  auStack_f0 = (undefined1  [8])0x5240ec;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),8,0);
  auStack_f0 = (undefined1  [8])0x5240fb;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),9,0);
  auStack_f0 = (undefined1  [8])0x52410d;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),10,-1);
  auStack_f0 = (undefined1  [8])0x52411c;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xb,0);
  auStack_f0 = (undefined1  [8])0x52412e;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xc,1);
  auStack_f0 = (undefined1  [8])0x524140;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xe,1);
  auStack_f0 = (undefined1  [8])0x52414d;
  (*this->qkv_gemm->_vptr_Layer[2])();
  pLVar24 = this->qkv_gemm;
  auStack_f0 = (undefined1  [8])0x52415d;
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_d8,(Mat *)0x0);
  auStack_f0 = (undefined1  [8])0x52416b;
  (*pLVar24->_vptr_Layer[3])(pLVar24,&local_d8);
  auStack_f0 = (undefined1  [8])0x524178;
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_d8);
  uVar15._0_1_ = opt->lightmode;
  uVar15._1_3_ = *(undefined3 *)&opt->field_0x1;
  uVar15._4_4_ = opt->num_threads;
  uVar16 = opt->openmp_blocktime;
  uVar17 = opt->use_winograd_convolution;
  uVar19 = opt->use_sgemm_convolution;
  uVar21 = opt->use_int8_inference;
  uVar23 = opt->use_vulkan_compute;
  uVar22 = CONCAT11(uVar23,uVar21);
  uVar20 = CONCAT21(uVar22,uVar19);
  uVar18 = CONCAT31(uVar20,uVar17);
  local_d8.allocator = *(Allocator **)&opt->use_bf16_storage;
  local_d8._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
  local_d8._48_8_ = *(undefined8 *)&opt->flush_denormals;
  local_d8._56_8_ = *(undefined8 *)&opt->use_winograd43_convolution;
  local_d8.refcount._0_4_ = SUB84(opt->blob_allocator,0);
  local_d8.refcount._4_4_ = (undefined4)((ulong)opt->blob_allocator >> 0x20);
  local_d8.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
  local_d8.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
  local_d8.data._0_4_ = (undefined4)uVar15;
  local_d8.data = (void *)CONCAT44(1,local_d8.data._0_4_);
  auStack_f0 = (undefined1  [8])0x5241a8;
  local_d8.elempack = uVar16;
  local_d8._28_4_ = uVar18;
  (*this->qkv_gemm->_vptr_Layer[4])();
  auStack_f0 = (undefined1  [8])0x5241b0;
  ParamDict::~ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x5241ba;
  pLVar24 = create_layer(0x20);
  this->qk_softmax = pLVar24;
  auStack_f0 = (undefined1  [8])0x5241cb;
  ParamDict::ParamDict((ParamDict *)&local_d8);
  auStack_f0 = (undefined1  [8])0x5241da;
  ParamDict::set((ParamDict *)&local_d8,0,-1);
  auStack_f0 = (undefined1  [8])0x5241ee;
  ParamDict::set((ParamDict *)&local_d8,1,1);
  auStack_f0 = (undefined1  [8])0x5241fd;
  (*this->qk_softmax->_vptr_Layer[2])();
  pLVar24 = this->qk_softmax;
  auStack_f0 = (undefined1  [8])0x52420b;
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),
             (Mat *)0x0);
  auStack_f0 = (undefined1  [8])0x524217;
  (*pLVar24->_vptr_Layer[3])(pLVar24,(undefined1 *)((long)register0x00000020 + -0xec) + 4);
  auStack_f0 = (undefined1  [8])0x52421f;
  ModelBinFromMatArray::~ModelBinFromMatArray
            ((ModelBinFromMatArray *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x52422c;
  (*this->qk_softmax->_vptr_Layer[4])(this->qk_softmax,opt);
  auStack_f0 = (undefined1  [8])0x524239;
  ParamDict::~ParamDict((ParamDict *)&local_d8);
  auStack_f0 = (undefined1  [8])0x524243;
  pLVar24 = create_layer(0x4a);
  this->o_gemm = pLVar24;
  auStack_f0 = (undefined1  [8])0x524252;
  ParamDict::ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  auStack_f0 = (undefined1  [8])0x524264;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),2,1);
  auStack_f0 = (undefined1  [8])0x524276;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),3,1);
  auStack_f0 = (undefined1  [8])0x524285;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),4,0);
  auStack_f0 = (undefined1  [8])0x524297;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),5,1);
  auStack_f0 = (undefined1  [8])0x5242a9;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),6,1);
  auStack_f0 = (undefined1  [8])0x5242b8;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),7,0);
  auStack_f0 = (undefined1  [8])0x5242d3;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),8,
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86_avx[-3]));
  auStack_f0 = (undefined1  [8])0x5242ee;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),9,
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86_avx[-3]));
  auStack_f0 = (undefined1  [8])0x524300;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),10,4);
  auStack_f0 = (undefined1  [8])0x52430f;
  ParamDict::set((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4),0xb,0);
  auStack_f0 = (undefined1  [8])0x52431c;
  (*this->o_gemm->_vptr_Layer[2])(this->o_gemm,(undefined1 *)((long)register0x00000020 + -0xec) + 4)
  ;
  lVar25 = 0x40;
  do {
    *(undefined8 *)((long)&local_d8.data + lVar25) = 0;
    *(undefined8 *)((long)&uStack_118 + lVar25) = 0;
    *(undefined8 *)(&stack0xfffffffffffffef0 + lVar25) = 0;
    *(undefined8 *)((long)auStack_10c + lVar25) = 0;
    *(undefined8 *)((long)auStack_10c + lVar25 + 8) = 0;
    *(undefined8 *)((long)&uStack_f8 + lVar25) = 0;
    *(undefined8 *)(&stack0xffffffffffffff10 + lVar25) = 0;
    *(undefined8 *)((undefined1 *)((long)register0x00000020 + -0xec) + lVar25) = 0;
    *(undefined8 *)((long)&uStack_e4 + lVar25) = 0;
    lVar25 = lVar25 + 0x48;
  } while (lVar25 != 0xd0);
  p_Var1 = this->_vptr_MultiHeadAttention_x86_avx[-3];
  if (&local_d8 != (Mat *)(&this->field_0x298 + (long)p_Var1)) {
    piVar2 = *(int **)(&this->field_0x2a0 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x5243b2;
            free(local_d8.data);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x5243a3;
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_d8.data = *(void **)(&this->field_0x298 + (long)p_Var1);
    local_d8.refcount._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x2a0 + (long)p_Var1);
    local_d8.refcount._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x2a0 + (long)p_Var1) >> 0x20);
    local_d8.elemsize._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x2a8 + (long)p_Var1);
    local_d8.elemsize._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x2a8 + (long)p_Var1) >> 0x20);
    local_d8.elempack = *(int *)(&this->field_0x2b0 + (long)p_Var1);
    local_d8.allocator = *(Allocator **)(&this->field_0x2b8 + (long)p_Var1);
    local_d8._40_8_ = *(undefined8 *)(&this->field_0x2c0 + (long)p_Var1);
    local_d8._48_8_ = *(undefined8 *)(&this->field_0x2c8 + (long)p_Var1);
    local_d8._60_4_ = local_d8._60_4_;
    local_d8.c = *(int *)(&this->field_0x2d0 + (long)p_Var1);
    local_d8.cstep = *(size_t *)(&this->field_0x2d8 + (long)p_Var1);
  }
  p_Var1 = this->_vptr_MultiHeadAttention_x86_avx[-3];
  if (&local_90 != (void **)(&this->field_0x2e0 + (long)p_Var1)) {
    piVar2 = *(int **)(&this->field_0x2e8 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(uStack_84,uStack_88);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_70 == (long *)0x0) {
          if (local_90 != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x524497;
            free(local_90);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x524488;
          (**(code **)(*local_70 + 0x18))();
        }
      }
    }
    local_90 = *(void **)(&this->field_0x2e0 + (long)p_Var1);
    uStack_88 = (undefined4)*(undefined8 *)(&this->field_0x2e8 + (long)p_Var1);
    uStack_84 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x2e8 + (long)p_Var1) >> 0x20);
    uStack_80 = (undefined4)*(undefined8 *)(&this->field_0x2f0 + (long)p_Var1);
    uStack_7c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x2f0 + (long)p_Var1) >> 0x20);
    uStack_78 = *(undefined4 *)(&this->field_0x2f8 + (long)p_Var1);
    local_70 = *(long **)(&this->field_0x300 + (long)p_Var1);
    local_68 = *(undefined8 *)(&this->field_0x308 + (long)p_Var1);
    uStack_60 = *(undefined8 *)(&this->field_0x310 + (long)p_Var1);
    local_58 = *(undefined4 *)(&this->field_0x318 + (long)p_Var1);
    local_50 = *(undefined8 *)(&this->field_0x320 + (long)p_Var1);
  }
  pLVar24 = this->o_gemm;
  auStack_f0 = (undefined1  [8])0x52453e;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_48,&local_d8);
  auStack_f0 = (undefined1  [8])0x52454f;
  (*pLVar24->_vptr_Layer[3])(pLVar24,&local_48);
  auStack_f0 = (undefined1  [8])0x52455c;
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_48);
  auStack_f0 = (undefined1  [8])0x524569;
  (*this->o_gemm->_vptr_Layer[4])(this->o_gemm,opt);
  if (opt->lightmode != false) {
    p_Var1 = this->_vptr_MultiHeadAttention_x86_avx[-3];
    piVar2 = *(int **)(&this->field_0x2a0 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x2b8 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x298 + (long)p_Var1) != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x5245b8;
            free(*(void **)(&this->field_0x298 + (long)p_Var1));
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x5245a9;
          (**(code **)(**(long **)(&this->field_0x2b8 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x2d8 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2a4 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2ac + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x298 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2a0 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2c0 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2c8 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x2d0 + (long)p_Var1) = 0;
    p_Var1 = this->_vptr_MultiHeadAttention_x86_avx[-3];
    piVar2 = *(int **)(&this->field_0x2e8 + (long)p_Var1);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x300 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x2e0 + (long)p_Var1) != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x524637;
            free(*(void **)(&this->field_0x2e0 + (long)p_Var1));
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x524624;
          (**(code **)(**(long **)(&this->field_0x300 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x320 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2ec + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2f4 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2e0 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x2e8 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x308 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x310 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x318 + (long)p_Var1) = 0;
  }
  lVar25 = 0x48;
  do {
    piVar2 = *(int **)((long)&local_d8.refcount + lVar25);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = *(void **)((long)&local_d8.data + lVar25);
        plVar4 = *(long **)((long)&local_d8.allocator + lVar25);
        if (plVar4 == (long *)0x0) {
          if (pvVar3 != (void *)0x0) {
            auStack_f0 = (undefined1  [8])0x5246ad;
            free(pvVar3);
          }
        }
        else {
          auStack_f0 = (undefined1  [8])0x52469a;
          (**(code **)(*plVar4 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_d8.cstep + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar25 + 4) = 0;
    *(undefined8 *)((long)&local_d8.elemsize + lVar25 + 4) = 0;
    *(undefined8 *)((long)&local_d8.data + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.dims + lVar25) = 0;
    *(undefined8 *)((long)&local_d8.h + lVar25) = 0;
    *(undefined4 *)((long)&local_d8.c + lVar25) = 0;
    lVar25 = lVar25 + -0x48;
  } while (lVar25 != -0x48);
  auStack_f0 = (undefined1  [8])0x5246e8;
  ParamDict::~ParamDict((ParamDict *)((undefined1 *)((long)register0x00000020 + -0xec) + 4));
  return 0;
}

Assistant:

int MultiHeadAttention_x86_avx::create_pipeline(const Option& opt)
{
    {
        const int embed_dim_per_head = embed_dim / num_heads;
        const float inv_sqrt_embed_dim_per_head = 1.f / sqrtf(embed_dim_per_head);

        q_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(0, inv_sqrt_embed_dim_per_head);
        pd.set(1, 1.f);
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, embed_dim); // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
        q_gemm->load_param(pd);
        Mat weights[2];
        weights[0] = q_weight_data;
        weights[1] = q_bias_data;
        q_gemm->load_model(ModelBinFromMatArray(weights));
        q_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            q_weight_data.release();
            q_bias_data.release();
        }
    }

    {
        k_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, kdim);      // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
        k_gemm->load_param(pd);
        Mat weights[2];
        weights[0] = k_weight_data;
        weights[1] = k_bias_data;
        k_gemm->load_model(ModelBinFromMatArray(weights));
        k_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            k_weight_data.release();
            k_bias_data.release();
        }
    }

    {
        v_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, vdim);      // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
        v_gemm->load_param(pd);
        Mat weights[2];
        weights[0] = v_weight_data;
        weights[1] = v_bias_data;
        v_gemm->load_model(ModelBinFromMatArray(weights));
        v_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            v_weight_data.release();
            v_bias_data.release();
        }
    }

    {
        qk_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 1);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 0);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, attn_mask ? 0 : 1);   // constantC
        pd.set(7, 0);                   // M
        pd.set(8, 0);                   // N
        pd.set(9, 0);                   // K
        pd.set(10, attn_mask ? 3 : -1); // constant_broadcast_type_C
        pd.set(11, 0);                  // output_N1M
        pd.set(12, 1);                  // output_elempack
        qk_gemm->load_param(pd);
        qk_gemm->load_model(ModelBinFromMatArray(0));
        Option opt1 = opt;
        opt1.num_threads = 1;
        qk_gemm->create_pipeline(opt1);
    }
    {
        qkv_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);   // transA
        pd.set(3, 1);   // transB
        pd.set(4, 0);   // constantA
        pd.set(5, 0);   // constantB
        pd.set(6, 1);   // constantC
        pd.set(7, 0);   // M
        pd.set(8, 0);   // N
        pd.set(9, 0);   // K
        pd.set(10, -1); // constant_broadcast_type_C
        pd.set(11, 0);  // output_N1M
        pd.set(12, 1);  // output_elempack
        pd.set(14, 1);  // output_transpose
        qkv_gemm->load_param(pd);
        qkv_gemm->load_model(ModelBinFromMatArray(0));
        Option opt1 = opt;
        opt1.num_threads = 1;
        qkv_gemm->create_pipeline(opt1);
    }

    {
        qk_softmax = ncnn::create_layer(ncnn::LayerType::Softmax);
        ncnn::ParamDict pd;
        pd.set(0, -1);
        pd.set(1, 1);
        qk_softmax->load_param(pd);
        qk_softmax->load_model(ModelBinFromMatArray(0));
        qk_softmax->create_pipeline(opt);
    }

    {
        o_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 1);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 0);         // constantA
        pd.set(5, 1);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, 0);         // M = outch
        pd.set(8, embed_dim); // N = size
        pd.set(9, embed_dim); // K = maxk*inch
        pd.set(10, 4);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        o_gemm->load_param(pd);
        Mat weights[2];
        weights[0] = out_weight_data;
        weights[1] = out_bias_data;
        o_gemm->load_model(ModelBinFromMatArray(weights));
        o_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            out_weight_data.release();
            out_bias_data.release();
        }
    }

    return 0;
}